

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O3

int __thiscall
xercesc_4_0::RegularExpression::matchUnion
          (RegularExpression *this,Context *context,Op *op,XMLSize_t offset)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  Context tmpContext;
  Context bestResultContext;
  uint local_fc;
  Context local_e0;
  Context local_88;
  
  iVar2 = (*op->_vptr_Op[4])(op);
  Context::Context(&local_88,XMLPlatformUtils::fgMemoryManager);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    local_fc = 0xffffffff;
    lVar5 = 0;
    do {
      Context::Context(&local_e0,context);
      iVar3 = (*op->_vptr_Op[5])(op,lVar5);
      uVar4 = match(this,&local_e0,(Op *)CONCAT44(extraout_var_00,iVar3),offset);
      if (((int)uVar4 < 0) || ((int)uVar4 <= (int)local_fc || context->fLimit < (ulong)uVar4)) {
        Context::~Context(&local_e0);
      }
      else {
        Context::operator=(&local_88,&local_e0);
        uVar1 = context->fLimit;
        Context::~Context(&local_e0);
        local_fc = uVar4;
        if (uVar1 == uVar4) goto LAB_0023dc6c;
      }
      lVar5 = lVar5 + 1;
    } while (CONCAT44(extraout_var,iVar2) != lVar5);
    uVar4 = local_fc;
    if (local_fc != 0xffffffff) {
LAB_0023dc6c:
      Context::operator=(context,&local_88);
      goto LAB_0023dc84;
    }
  }
  uVar4 = 0xffffffff;
LAB_0023dc84:
  Context::~Context(&local_88);
  return uVar4;
}

Assistant:

int RegularExpression::matchUnion(Context* const context,
                                   const Op* const op, XMLSize_t offset) const
{
    XMLSize_t opSize = op->getSize();

    Context bestResultContext;
    int bestResult=-1;
    for(XMLSize_t i=0; i < opSize; i++) {
        Context tmpContext(context);
        int ret = match(&tmpContext, op->elementAt(i), offset);
        if (ret >= 0 && (XMLSize_t)ret <= context->fLimit && ret>bestResult)
        {
            bestResult=ret;
            bestResultContext=tmpContext;
            // exit early, if we reached the end of the string
            if((XMLSize_t)ret == context->fLimit)
                break;
        }
    }
    if(bestResult!=-1)
        *context=bestResultContext;
    return bestResult;
}